

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::LatticeBuilder<OpenMD::FCCLattice>::~LatticeBuilder
          (LatticeBuilder<OpenMD::FCCLattice> *this)

{
  void *in_RDI;
  
  ~LatticeBuilder((LatticeBuilder<OpenMD::FCCLattice> *)0x1f8b68);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual Lattice* create() const { return new ConcreteLattice(); }